

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O3

void __thiscall
tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::resize
          (SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0> *this,
          size_type new_size)

{
  value_type *__src;
  value_type *__dest;
  ulong uVar1;
  value_type *tmp;
  
  __src = this->array_;
  __dest = (value_type *)operator_new__(-(ulong)(new_size >> 0x3d != 0) | new_size * 8);
  this->array_ = __dest;
  if (__src != (value_type *)0x0) {
    uVar1 = this->size_;
    if (new_size <= this->size_) {
      uVar1 = new_size;
    }
    if (uVar1 != 0) {
      memmove(__dest,__src,uVar1 << 3);
    }
    operator_delete__(__src);
  }
  this->size_ = new_size;
  return;
}

Assistant:

void resize(size_type new_size) {
        if (array_) {
            value_type* tmp = array_;
            array_ = create_array(new_size);
            std::move(tmp, tmp + std::min(size_, new_size), array_);
            destroy_array(tmp, size_);
            size_ = new_size;
        }
        else {
            array_ = create_array(new_size);
            size_ = new_size;
        }
    }